

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char msg [800000];
  
  signal(2,signal_handler);
  signal(0xf,signal_handler);
  ctx = mk_create();
  if (ctx == (mk_ctx_t *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = mk_mq_create(ctx,"/data",cb_queue_message,(void *)0x0);
    mk_config_set(ctx,"Listen","9080",0);
    iVar2 = mk_vhost_create(ctx,(char *)0x0);
    mk_vhost_set(ctx,iVar2,"Name","monotop");
    mk_vhost_handler(ctx,iVar2,"/api/v1/stream_processor/task/[A-Za-z_][0-9A-Za-z_\\-]*",
                     cb_sp_test_task_detail,(void *)0x0);
    mk_vhost_handler(ctx,iVar2,"/api/v1/stream_processor/task",cb_sp_test_task_main,(void *)0x0);
    mk_vhost_handler(ctx,iVar2,"/test_chunks",cb_test_chunks,(void *)0x0);
    mk_vhost_handler(ctx,iVar2,"/test_big_chunk",cb_test_big_chunk,(void *)0x0);
    mk_vhost_handler(ctx,iVar2,"/",cb_main,(void *)0x0);
    mk_worker_callback(ctx,cb_worker,ctx);
    mk_print(0x1000,"Service: http://%s:%s/test_chunks","127.0.0.1","9080");
    mk_start(ctx);
    for (uVar3 = 0; uVar3 != 5; uVar3 = uVar3 + 1) {
      iVar2 = snprintf(msg,799999,"[...] message ID: %i\n",(ulong)uVar3);
      mk_mq_send(ctx,iVar1,msg,(long)iVar2);
    }
    sleep(0xe10);
    mk_stop(ctx);
    mk_destroy(ctx);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main()
{
    int i = 0;
    int len;
    int vid;
    int qid;
    char msg[800000];

    signal_init();

    ctx = mk_create();
    if (!ctx) {
        return -1;
    }

    /* Create a message queue and a callback for each message */
    qid = mk_mq_create(ctx, "/data", cb_queue_message, NULL);

    mk_config_set(ctx,
                  "Listen", API_PORT,
                  //"Timeout", "1",
                  NULL);

    vid = mk_vhost_create(ctx, NULL);
    mk_vhost_set(ctx, vid,
                 "Name", "monotop",
                 NULL);

    mk_vhost_handler(ctx, vid, "/api/v1/stream_processor/task/[A-Za-z_][0-9A-Za-z_\\-]*",
                     cb_sp_test_task_detail, NULL);

    mk_vhost_handler(ctx, vid, "/api/v1/stream_processor/task",
                     cb_sp_test_task_main, NULL);

    mk_vhost_handler(ctx, vid, "/test_chunks", cb_test_chunks, NULL);
    mk_vhost_handler(ctx, vid, "/test_big_chunk", cb_test_big_chunk, NULL);
    mk_vhost_handler(ctx, vid, "/", cb_main, NULL);


    mk_worker_callback(ctx,
                       cb_worker,
                       ctx);

    mk_info("Service: http://%s:%s/test_chunks",  API_ADDR, API_PORT);
    mk_start(ctx);

    for (i = 0; i < 5; i++) {
        len = snprintf(msg, sizeof(msg) - 1, "[...] message ID: %i\n", i);
        mk_mq_send(ctx, qid, &msg, len);
    }

    sleep(3600);

    mk_stop(ctx);
    mk_destroy(ctx);


    return 0;
}